

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

spvc_constant spvc_compiler_get_constant_handle(spvc_compiler compiler,spvc_variable_id id)

{
  SPIRConstant *pSVar1;
  
  pSVar1 = spirv_cross::Compiler::get_constant
                     ((compiler->compiler)._M_t.
                      super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                      .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,
                      (ConstantID)id);
  return (spvc_constant)pSVar1;
}

Assistant:

spvc_constant spvc_compiler_get_constant_handle(spvc_compiler compiler, spvc_variable_id id)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		return static_cast<spvc_constant>(&compiler->compiler->get_constant(id));
	}